

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.h
# Opt level: O3

void PatternMatch_TypeDecl(KonohaContext *kctx,KonohaStack *sfp)

{
  int endIdx;
  kNameSpace *node;
  kException *tokenList;
  KClass *pKVar1;
  int iVar2;
  int iVar3;
  kNameSpace *pkVar4;
  uintptr_t uVar5;
  uintptr_t *puVar6;
  kNameSpace *ns;
  KClass *foundClass;
  KClass *local_38;
  
  node = sfp[1].field_0.asNameSpace;
  tokenList = sfp[3].field_0.asException;
  iVar3 = *(int *)&sfp[4].field_1;
  endIdx = *(int *)&sfp[6].field_1;
  (*(kctx->platApi->ConsoleModule).ReportDebugMessage)
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/konoha-project[P]konoha3/src/parser/import/syntax.h"
             ,"PatternMatch_TypeDecl",0x7f,"tracing..");
  pKVar1 = *(KClass **)((kctx->share->classTable).field_1.bytebuf + 0x58);
  pkVar4 = node;
  do {
    ns = ((anon_union_8_4_b004c7c0_for_kNodeVar_7 *)&pkVar4->importedNameSpaceList)->StmtNameSpace;
    if ((((anon_union_8_4_b004c7c0_for_kNodeVar_7 *)&pkVar4->importedNameSpaceList)->StmtNameSpace->
        h).ct == pKVar1) break;
    pkVar4 = ((anon_union_8_2_7d56b7f0_for_kNodeVar_3 *)&pkVar4->packageId)->RootNodeNameSpace;
    ns = pkVar4;
  } while ((pkVar4->h).ct != pKVar1);
  local_38 = (KClass *)0x0;
  iVar2 = ParseTypePattern(kctx,ns,(kArray *)tokenList,iVar3,endIdx,&local_38);
  uVar5 = 0xffffffffffffffff;
  if (iVar2 != -1) {
    if (iVar2 < endIdx) {
      puVar6 = ((anon_union_8_14_74a59a6a_for_kArrayVar_2 *)&tokenList->uline)->unboxItems + iVar2;
      do {
        if ((*(int *)(*(long *)(*puVar6 + 0x38) + 0x60) != 2000) &&
           (*(int *)(*puVar6 + 0x28) != -0x1fffffff)) goto LAB_00117abe;
        iVar2 = iVar2 + 1;
        puVar6 = puVar6 + 1;
      } while (endIdx != iVar2);
    }
    else {
LAB_00117abe:
      if ((iVar2 < endIdx) &&
         (*(int *)(((anon_union_8_14_74a59a6a_for_kArrayVar_2 *)&tokenList->uline)->unboxItems
                   [iVar2] + 0x28) == -0x1ffffffe)) {
        iVar3 = ParseSyntaxPattern(kctx,ns,(kNode *)node,
                                   *(kSyntax **)((node->constTable).data.bytesize + 0x28),
                                   (kArray *)tokenList,iVar3,endIdx);
        uVar5 = (uintptr_t)iVar3;
      }
    }
  }
  sfp[-4].field_1.unboxValue = uVar5;
  return;
}

Assistant:

static KMETHOD PatternMatch_TypeDecl(KonohaContext *kctx, KonohaStack *sfp)
{
	VAR_PatternMatch(stmt, name, tokenList, beginIdx, endIdx);
	kNameSpace *ns = kNode_ns(stmt);
	KClass *foundClass = NULL;
	int nextIdx = ParseTypePattern(kctx, ns, tokenList, beginIdx, endIdx, &foundClass);
	//DBG_P("@ nextIdx = %d < %d", nextIdx, endIdx);
	if(nextIdx != -1) {
		nextIdx = TokenUtils_SkipIndent(tokenList, nextIdx, endIdx);
		if(nextIdx < endIdx) {
			kToken *tk = tokenList->TokenItems[nextIdx];
			if(tk->tokenType == KSymbol_SymbolPattern) {
				KReturnUnboxValue(ParseSyntaxPattern(kctx, ns, stmt, stmt->syn, tokenList, beginIdx, endIdx));
			}
		}
	}
	KReturnUnboxValue(-1);
}